

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<double>_>::Subst_Backward
          (TPZMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  long lVar1;
  int64_t iVar2;
  long lVar3;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int64_t i;
  complex<double> sum;
  int64_t c;
  complex<double> pivot;
  int64_t r;
  complex<double> *in_stack_ffffffffffffff18;
  TPZBaseMatrix *in_stack_ffffffffffffff20;
  undefined1 local_90 [8];
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_58;
  long local_50;
  complex<double> local_48;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar2 == lVar3) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = (**(code **)(*in_RDI + 0x60))();
    while (local_20 = local_20 + -1, -1 < local_20) {
      local_30 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_20);
      local_28 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
      for (local_38 = 0; lVar3 = local_38, iVar2 = TPZBaseMatrix::Cols(local_18), lVar3 < iVar2;
          local_38 = local_38 + 1) {
        in_XMM1_Da = 0;
        in_XMM1_Db = 0;
        std::complex<double>::complex(&local_48,0.0,0.0);
        local_50 = (**(code **)(*in_RDI + 0x60))();
        while (lVar1 = local_20, lVar3 = local_38, local_50 = local_50 + -1, local_20 < local_50) {
          local_70 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_50);
          local_68 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_50,local_38);
          local_78 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
          std::operator*(in_stack_ffffffffffffff18,(complex<double> *)0x12b9aad);
          local_58 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
          std::complex<double>::operator+=
                    ((complex<double> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        in_stack_ffffffffffffff20 = local_18;
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_20,local_38);
        std::operator-(in_stack_ffffffffffffff18,(complex<double> *)0x12b9b53);
        std::operator/(in_stack_ffffffffffffff18,(complex<double> *)0x12b9b71);
        local_88 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
        (*(in_stack_ffffffffffffff20->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_stack_ffffffffffffff20,lVar1,lVar3,local_90);
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}